

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeSorterCompareInt
              (SortSubtask *pTask,int *pbKey2Cached,void *pKey1,int nKey1,void *pKey2,int nKey2)

{
  uint uVar1;
  uint uVar2;
  byte *pbVar3;
  byte *pbVar4;
  int local_6c;
  int i;
  u8 n;
  int res;
  u8 *v2;
  u8 *v1;
  int s2;
  int s1;
  u8 *p2;
  u8 *p1;
  int nKey2_local;
  void *pKey2_local;
  int nKey1_local;
  void *pKey1_local;
  int *pbKey2Cached_local;
  SortSubtask *pTask_local;
  
  uVar1 = (uint)*(byte *)((long)pKey1 + 1);
  uVar2 = (uint)*(byte *)((long)pKey2 + 1);
  pbVar3 = (byte *)((long)pKey1 + (ulong)*pKey1);
  pbVar4 = (byte *)((long)pKey2 + (ulong)*pKey2);
  if (uVar1 == uVar2) {
    i = 0;
    for (local_6c = 0; local_6c < (int)(uint)""[(int)uVar1]; local_6c = local_6c + 1) {
      i = (uint)pbVar3[local_6c] - (uint)pbVar4[local_6c];
      if (i != 0) {
        if ((((*pbVar3 ^ *pbVar4) & 0x80) != 0) && (i = 1, (*pbVar3 & 0x80) != 0)) {
          i = -1;
        }
        break;
      }
    }
  }
  else if ((uVar1 < 8) || (uVar2 < 8)) {
    if (uVar2 < 8) {
      if (uVar1 < 8) {
        i = uVar1 - uVar2;
      }
      else {
        i = -1;
      }
    }
    else {
      i = 1;
    }
    if (i < 1) {
      if ((*pbVar4 & 0x80) != 0) {
        i = 1;
      }
    }
    else if ((*pbVar3 & 0x80) != 0) {
      i = -1;
    }
  }
  else {
    i = uVar1 - uVar2;
  }
  if (i == 0) {
    if (1 < pTask->pSorter->pKeyInfo->nKeyField) {
      i = vdbeSorterCompareTail(pTask,pbKey2Cached,pKey1,nKey1,pKey2,nKey2);
    }
  }
  else if (*pTask->pSorter->pKeyInfo->aSortFlags != '\0') {
    i = -i;
  }
  return i;
}

Assistant:

static int vdbeSorterCompareInt(
  SortSubtask *pTask,             /* Subtask context (for pKeyInfo) */
  int *pbKey2Cached,              /* True if pTask->pUnpacked is pKey2 */
  const void *pKey1, int nKey1,   /* Left side of comparison */
  const void *pKey2, int nKey2    /* Right side of comparison */
){
  const u8 * const p1 = (const u8 * const)pKey1;
  const u8 * const p2 = (const u8 * const)pKey2;
  const int s1 = p1[1];                 /* Left hand serial type */
  const int s2 = p2[1];                 /* Right hand serial type */
  const u8 * const v1 = &p1[ p1[0] ];   /* Pointer to value 1 */
  const u8 * const v2 = &p2[ p2[0] ];   /* Pointer to value 2 */
  int res;                              /* Return value */

  assert( (s1>0 && s1<7) || s1==8 || s1==9 );
  assert( (s2>0 && s2<7) || s2==8 || s2==9 );

  if( s1==s2 ){
    /* The two values have the same sign. Compare using memcmp(). */
    static const u8 aLen[] = {0, 1, 2, 3, 4, 6, 8, 0, 0, 0 };
    const u8 n = aLen[s1];
    int i;
    res = 0;
    for(i=0; i<n; i++){
      if( (res = v1[i] - v2[i])!=0 ){
        if( ((v1[0] ^ v2[0]) & 0x80)!=0 ){
          res = v1[0] & 0x80 ? -1 : +1;
        }
        break;
      }
    }
  }else if( s1>7 && s2>7 ){
    res = s1 - s2;
  }else{
    if( s2>7 ){
      res = +1;
    }else if( s1>7 ){
      res = -1;
    }else{
      res = s1 - s2;
    }
    assert( res!=0 );

    if( res>0 ){
      if( *v1 & 0x80 ) res = -1;
    }else{
      if( *v2 & 0x80 ) res = +1;
    }
  }

  if( res==0 ){
    if( pTask->pSorter->pKeyInfo->nKeyField>1 ){
      res = vdbeSorterCompareTail(
          pTask, pbKey2Cached, pKey1, nKey1, pKey2, nKey2
      );
    }
  }else if( pTask->pSorter->pKeyInfo->aSortFlags[0] ){
    assert( !(pTask->pSorter->pKeyInfo->aSortFlags[0]&KEYINFO_ORDER_BIGNULL) );
    res = res * -1;
  }

  return res;
}